

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O3

void xmrig::cryptonight_quad_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  cryptonight_ctx *pcVar25;
  cryptonight_ctx *pcVar26;
  uint8_t *puVar27;
  uint8_t *puVar28;
  cryptonight_ctx *pcVar29;
  uint8_t *puVar30;
  cryptonight_ctx *pcVar31;
  uint8_t *puVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined1 auVar52 [16];
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  size_t i;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  undefined1 auVar83 [16];
  ulong uVar86;
  undefined1 auVar84 [16];
  ulong uVar87;
  ulong uVar88;
  undefined1 auVar85 [16];
  ulong uVar89;
  undefined1 auVar90 [16];
  ulong uVar91;
  ulong uVar93;
  undefined1 auVar92 [16];
  long lVar94;
  long lVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar102;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ulong uVar106;
  ulong uVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  ulong uVar115;
  ulong uVar116;
  long local_1d8;
  long local_1c8;
  long local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  lVar63 = 0;
  do {
    pcVar25 = ctx[lVar63];
    keccak(input,(int)size,pcVar25->state,200);
    cn_explode_scratchpad<true>((__m128i *)pcVar25,(__m128i *)pcVar25->memory);
    lVar63 = lVar63 + 1;
    input = input + size;
  } while (lVar63 != 4);
  pcVar25 = *ctx;
  pcVar26 = ctx[1];
  puVar27 = pcVar25->memory;
  puVar28 = pcVar26->memory;
  pcVar29 = ctx[2];
  puVar30 = pcVar29->memory;
  pcVar31 = ctx[3];
  puVar32 = pcVar31->memory;
  uVar116 = *(ulong *)(pcVar25->state + 0x60);
  local_1d8 = *(long *)(pcVar25->state + 0x68);
  auVar34 = *(undefined1 (*) [16])pcVar25->state;
  auVar33 = *(undefined1 (*) [16])(pcVar25->state + 0x10);
  auVar83 = *(undefined1 (*) [16])(pcVar25->state + 0x20);
  auVar105 = *(undefined1 (*) [16])(pcVar25->state + 0x30);
  uVar80 = *(ulong *)(pcVar25->state + 0x40);
  uVar81 = *(ulong *)(pcVar25->state + 0x48);
  uVar87 = *(ulong *)(pcVar25->state + 0x50);
  uVar88 = *(ulong *)(pcVar25->state + 0x58);
  uVar115 = *(ulong *)(pcVar26->state + 0x60);
  local_1c8 = *(long *)(pcVar26->state + 0x68);
  uVar64 = *(ulong *)pcVar26->state;
  uVar106 = *(ulong *)(pcVar26->state + 8);
  uVar108 = *(ulong *)(pcVar26->state + 0x10);
  uVar112 = *(ulong *)(pcVar26->state + 0x18);
  uVar109 = *(ulong *)(pcVar26->state + 0x20);
  uVar113 = *(ulong *)(pcVar26->state + 0x28);
  uVar56 = *(ulong *)(pcVar26->state + 0x30);
  uVar62 = *(ulong *)(pcVar26->state + 0x38);
  uVar74 = *(ulong *)(pcVar26->state + 0x40);
  uVar77 = *(ulong *)(pcVar26->state + 0x48);
  uVar61 = *(ulong *)(pcVar26->state + 0x50);
  uVar66 = *(ulong *)(pcVar26->state + 0x58);
  uVar96 = *(ulong *)(pcVar29->state + 0x60);
  local_1b8 = *(long *)(pcVar29->state + 0x68);
  uVar72 = *(ulong *)pcVar29->state;
  uVar55 = *(ulong *)(pcVar29->state + 8);
  uVar57 = *(ulong *)(pcVar29->state + 0x10);
  uVar58 = *(ulong *)(pcVar29->state + 0x18);
  uVar79 = *(ulong *)(pcVar29->state + 0x20);
  uVar86 = *(ulong *)(pcVar29->state + 0x28);
  uVar59 = *(ulong *)(pcVar29->state + 0x30);
  uVar60 = *(ulong *)(pcVar29->state + 0x38);
  uVar67 = *(ulong *)(pcVar31->state + 0x60);
  lVar63 = *(long *)(pcVar31->state + 0x68);
  uVar65 = *(ulong *)(pcVar29->state + 0x40);
  uVar68 = *(ulong *)(pcVar29->state + 0x48);
  uVar70 = *(ulong *)(pcVar29->state + 0x50);
  uVar71 = *(ulong *)(pcVar29->state + 0x58);
  uVar73 = *(ulong *)pcVar31->state;
  uVar75 = *(ulong *)(pcVar31->state + 8);
  uVar1 = *(undefined8 *)(pcVar31->state + 0x10);
  uVar45 = *(undefined8 *)(pcVar31->state + 0x18);
  uVar82 = *(ulong *)(pcVar31->state + 0x20);
  uVar89 = *(ulong *)(pcVar31->state + 0x28);
  uVar46 = *(undefined8 *)(pcVar31->state + 0x30);
  uVar47 = *(undefined8 *)(pcVar31->state + 0x38);
  uVar48 = *(undefined8 *)(pcVar31->state + 0x40);
  uVar49 = *(undefined8 *)(pcVar31->state + 0x48);
  uVar50 = *(undefined8 *)(pcVar31->state + 0x50);
  uVar51 = *(undefined8 *)(pcVar31->state + 0x58);
  fesetround(0x400);
  uVar54 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  if (uVar54 != 0) {
    local_e8._0_4_ = (uint)uVar50;
    local_e8._4_4_ = (uint)((ulong)uVar50 >> 0x20);
    uStack_e0._0_4_ = (uint)uVar51;
    uStack_e0._4_4_ = (uint)((ulong)uVar51 >> 0x20);
    local_48 = (uint)uVar48;
    uStack_44 = (uint)((ulong)uVar48 >> 0x20);
    uStack_40 = (uint)uVar49;
    uStack_3c = (uint)((ulong)uVar49 >> 0x20);
    local_e8 = CONCAT44(local_e8._4_4_ ^ uStack_44,(uint)local_e8 ^ local_48);
    uStack_e0 = CONCAT44(uStack_e0._4_4_ ^ uStack_3c,(uint)uStack_e0 ^ uStack_40);
    local_1a8._0_4_ = (uint)uVar46;
    local_1a8._4_4_ = (uint)((ulong)uVar46 >> 0x20);
    uStack_1a0._0_4_ = (uint)uVar47;
    uStack_1a0._4_4_ = (uint)((ulong)uVar47 >> 0x20);
    local_98 = (uint)uVar1;
    uStack_94 = (uint)((ulong)uVar1 >> 0x20);
    uStack_90 = (uint)uVar45;
    uStack_8c = (uint)((ulong)uVar45 >> 0x20);
    local_1a8 = CONCAT44(local_1a8._4_4_ ^ uStack_94,(uint)local_1a8 ^ local_98);
    uStack_1a0 = CONCAT44(uStack_1a0._4_4_ ^ uStack_8c,(uint)uStack_1a0 ^ uStack_90);
    uVar82 = uVar82 ^ uVar73;
    uVar89 = uVar89 ^ uVar75;
    uVar79 = uVar79 ^ uVar72;
    uVar86 = uVar86 ^ uVar55;
    uVar109 = uVar109 ^ uVar64;
    uVar113 = uVar113 ^ uVar106;
    auVar83 = auVar83 ^ auVar34;
    uVar72 = auVar83._0_8_;
    auVar105 = auVar105 ^ auVar33;
    uVar64 = uVar59 ^ uVar57;
    uVar106 = uVar60 ^ uVar58;
    uVar108 = uVar56 ^ uVar108;
    uVar112 = uVar62 ^ uVar112;
    uVar80 = uVar87 ^ uVar80;
    uVar81 = uVar88 ^ uVar81;
    uVar87 = uVar70 ^ uVar65;
    uVar88 = uVar71 ^ uVar68;
    uVar56 = uVar61 ^ uVar74;
    uVar62 = uVar66 ^ uVar77;
    do {
      uVar98 = uVar112;
      uVar97 = uVar108;
      uVar93 = uVar106;
      uVar91 = uVar64;
      uVar72 = uVar72 & 0xffff0;
      uVar69 = *(uint *)(puVar27 + uVar72);
      uVar2 = *(uint *)(puVar27 + uVar72 + 4);
      uVar3 = *(uint *)(puVar27 + uVar72 + 8);
      uVar4 = *(uint *)(puVar27 + uVar72 + 0xc);
      auVar103._12_4_ =
           saes_table[1][uVar69 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
           *(uint *)((long)saes_table[2] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
           *(uint *)((long)saes_table[3] + (ulong)(uVar3 >> 0x16 & 0xfffffffc));
      auVar103._8_4_ =
           saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar3 & 0xff] ^
           *(uint *)((long)saes_table[2] + (ulong)(uVar69 >> 0xe & 0x3fc)) ^
           *(uint *)((long)saes_table[3] + (ulong)(uVar2 >> 0x16 & 0xfffffffc));
      auVar103._4_4_ =
           saes_table[1][uVar3 >> 8 & 0xff] ^ saes_table[0][uVar2 & 0xff] ^
           *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
           *(uint *)((long)saes_table[3] + (ulong)(uVar69 >> 0x16 & 0xfffffffc));
      auVar103._0_4_ =
           saes_table[1][uVar2 >> 8 & 0xff] ^ saes_table[0][uVar69 & 0xff] ^
           *(uint *)((long)saes_table[2] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
           *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc));
      uVar64 = uVar109 & 0xffff0;
      uVar74 = uVar79 & 0xffff0;
      uVar77 = uVar82 & 0xffff0;
      uVar69 = *(uint *)(puVar28 + uVar64);
      uVar2 = *(uint *)(puVar28 + uVar64 + 4);
      uVar3 = *(uint *)(puVar28 + uVar64 + 8);
      uVar4 = *(uint *)(puVar28 + uVar64 + 0xc);
      uVar5 = *(uint *)(puVar30 + uVar74);
      uVar6 = *(uint *)(puVar30 + uVar74 + 4);
      uVar7 = *(uint *)(puVar30 + uVar74 + 8);
      lVar40 = *(long *)((long)(puVar27 + (uVar72 ^ 0x30)) + 8);
      uVar8 = *(uint *)(puVar30 + uVar74 + 0xc);
      uVar9 = *(uint *)(puVar32 + uVar77);
      uVar10 = *(uint *)(puVar32 + uVar77 + 4);
      uVar11 = *(uint *)(puVar32 + uVar77 + 8);
      uVar12 = *(uint *)(puVar32 + uVar77 + 0xc);
      lVar41 = *(long *)(puVar27 + (uVar72 ^ 0x10));
      lVar42 = *(long *)((long)(puVar27 + (uVar72 ^ 0x10)) + 8);
      lVar43 = *(long *)(puVar27 + (uVar72 ^ 0x20));
      lVar44 = *(long *)((long)(puVar27 + (uVar72 ^ 0x20)) + 8);
      *(ulong *)(puVar27 + (uVar72 ^ 0x10)) = *(long *)(puVar27 + (uVar72 ^ 0x30)) + uVar80;
      *(ulong *)((long)(puVar27 + (uVar72 ^ 0x10)) + 8) = lVar40 + uVar81;
      uVar107 = auVar105._0_8_;
      uVar111 = auVar105._8_8_;
      *(ulong *)(puVar27 + (uVar72 ^ 0x20)) = lVar41 + uVar107;
      *(ulong *)((long)(puVar27 + (uVar72 ^ 0x20)) + 8) = lVar42 + uVar111;
      lVar94 = auVar83._0_8_;
      lVar95 = auVar83._8_8_;
      *(long *)(puVar27 + (uVar72 ^ 0x30)) = lVar43 + lVar94;
      *(long *)((long)(puVar27 + (uVar72 ^ 0x30)) + 8) = lVar44 + lVar95;
      auVar103 = auVar103 ^ auVar83;
      *(undefined1 (*) [16])(puVar27 + uVar72) = auVar103 ^ auVar105;
      uVar13 = saes_table[1][uVar2 >> 8 & 0xff];
      uVar14 = saes_table[0][uVar69 & 0xff];
      uVar15 = saes_table[1][uVar3 >> 8 & 0xff];
      uVar16 = saes_table[0][uVar2 & 0xff];
      uVar17 = saes_table[1][uVar4 >> 8 & 0xff];
      uVar18 = saes_table[0][uVar3 & 0xff];
      uVar19 = saes_table[1][uVar69 >> 8 & 0xff];
      uVar20 = saes_table[0][uVar4 & 0xff];
      uVar21 = *(uint *)((long)saes_table[2] + (ulong)(uVar3 >> 0xe & 0x3fc));
      uVar22 = *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc));
      uVar23 = *(uint *)((long)saes_table[2] + (ulong)(uVar69 >> 0xe & 0x3fc));
      uVar24 = *(uint *)((long)saes_table[2] + (ulong)(uVar2 >> 0xe & 0x3fc));
      uVar2 = *(uint *)((long)saes_table[3] + (ulong)(uVar2 >> 0x16 & 0xfffffffc));
      uVar3 = *(uint *)((long)saes_table[3] + (ulong)(uVar3 >> 0x16 & 0xfffffffc));
      uVar4 = *(uint *)((long)saes_table[3] + (ulong)(uVar4 >> 0x16 & 0xfffffffc));
      uVar69 = *(uint *)((long)saes_table[3] + (ulong)(uVar69 >> 0x16 & 0xfffffffc));
      lVar40 = *(long *)((long)(puVar28 + (uVar64 ^ 0x30)) + 8);
      lVar41 = *(long *)(puVar28 + (uVar64 ^ 0x10));
      lVar42 = *(long *)((long)(puVar28 + (uVar64 ^ 0x10)) + 8);
      lVar43 = *(long *)(puVar28 + (uVar64 ^ 0x20));
      lVar44 = *(long *)((long)(puVar28 + (uVar64 ^ 0x20)) + 8);
      *(ulong *)(puVar28 + (uVar64 ^ 0x10)) = *(long *)(puVar28 + (uVar64 ^ 0x30)) + uVar56;
      *(ulong *)((long)(puVar28 + (uVar64 ^ 0x10)) + 8) = lVar40 + uVar62;
      *(ulong *)(puVar28 + (uVar64 ^ 0x20)) = lVar41 + uVar97;
      *(ulong *)((long)(puVar28 + (uVar64 ^ 0x20)) + 8) = lVar42 + uVar98;
      *(ulong *)(puVar28 + (uVar64 ^ 0x30)) = lVar43 + uVar109;
      *(ulong *)((long)(puVar28 + (uVar64 ^ 0x30)) + 8) = lVar44 + uVar113;
      uVar108 = CONCAT44(uVar15 ^ uVar16 ^ uVar22 ^ uVar69,uVar13 ^ uVar14 ^ uVar21 ^ uVar4) ^
                uVar109;
      uVar112 = CONCAT44(uVar19 ^ uVar20 ^ uVar24 ^ uVar3,uVar17 ^ uVar18 ^ uVar23 ^ uVar2) ^
                uVar113;
      *(ulong *)(puVar28 + uVar64) = uVar108 ^ uVar97;
      *(ulong *)((long)(puVar28 + uVar64) + 8) = uVar112 ^ uVar98;
      uVar69 = saes_table[1][uVar8 >> 8 & 0xff];
      uVar2 = saes_table[0][uVar7 & 0xff];
      uVar3 = saes_table[1][uVar5 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar8 & 0xff];
      uVar13 = *(uint *)((long)saes_table[2] + (ulong)(uVar5 >> 0xe & 0x3fc));
      uVar14 = *(uint *)((long)saes_table[2] + (ulong)(uVar6 >> 0xe & 0x3fc));
      uVar15 = *(uint *)((long)saes_table[3] + (ulong)(uVar6 >> 0x16 & 0xfffffffc));
      uVar16 = *(uint *)((long)saes_table[3] + (ulong)(uVar7 >> 0x16 & 0x3fc));
      uVar17 = saes_table[1][uVar6 >> 8 & 0xff];
      uVar18 = saes_table[0][uVar5 & 0xff];
      uVar19 = saes_table[1][uVar7 >> 8 & 0xff];
      uVar6 = saes_table[0][uVar6 & 0xff];
      uVar7 = *(uint *)((long)saes_table[2] + (ulong)(uVar7 >> 0xe & 0x3fc));
      uVar20 = *(uint *)((long)saes_table[2] + (ulong)(uVar8 >> 0xe & 0x3fc));
      uVar8 = *(uint *)((long)saes_table[3] + (ulong)(uVar8 >> 0x16 & 0xfffffffc));
      uVar5 = *(uint *)((long)saes_table[3] + (ulong)(uVar5 >> 0x16 & 0x3fc));
      lVar40 = *(long *)((long)(puVar30 + (uVar74 ^ 0x30)) + 8);
      lVar41 = *(long *)(puVar30 + (uVar74 ^ 0x10));
      lVar42 = *(long *)((long)(puVar30 + (uVar74 ^ 0x10)) + 8);
      lVar43 = *(long *)(puVar30 + (uVar74 ^ 0x20));
      lVar44 = *(long *)((long)(puVar30 + (uVar74 ^ 0x20)) + 8);
      *(ulong *)(puVar30 + (uVar74 ^ 0x10)) = *(long *)(puVar30 + (uVar74 ^ 0x30)) + uVar87;
      *(ulong *)((long)(puVar30 + (uVar74 ^ 0x10)) + 8) = lVar40 + uVar88;
      *(ulong *)(puVar30 + (uVar74 ^ 0x20)) = lVar41 + uVar91;
      *(ulong *)((long)(puVar30 + (uVar74 ^ 0x20)) + 8) = lVar42 + uVar93;
      *(ulong *)(puVar30 + (uVar74 ^ 0x30)) = lVar43 + uVar79;
      *(ulong *)((long)(puVar30 + (uVar74 ^ 0x30)) + 8) = lVar44 + uVar86;
      uVar64 = CONCAT44(uVar19 ^ uVar6 ^ uVar20 ^ uVar5,uVar17 ^ uVar18 ^ uVar7 ^ uVar8) ^ uVar79;
      uVar106 = CONCAT44(uVar3 ^ uVar4 ^ uVar14 ^ uVar16,uVar69 ^ uVar2 ^ uVar13 ^ uVar15) ^ uVar86;
      *(ulong *)(puVar30 + uVar74) = uVar64 ^ uVar91;
      *(ulong *)((long)(puVar30 + uVar74) + 8) = uVar106 ^ uVar93;
      uVar69 = saes_table[1][uVar12 >> 8 & 0xff];
      uVar2 = saes_table[0][uVar11 & 0xff];
      uVar3 = saes_table[1][uVar9 >> 8 & 0xff];
      uVar4 = saes_table[0][uVar12 & 0xff];
      uVar5 = *(uint *)((long)saes_table[2] + (ulong)(uVar9 >> 0xe & 0x3fc));
      uVar6 = *(uint *)((long)saes_table[2] + (ulong)(uVar10 >> 0xe & 0x3fc));
      uVar7 = *(uint *)((long)saes_table[3] + (ulong)(uVar10 >> 0x16 & 0xfffffffc));
      uVar8 = *(uint *)((long)saes_table[3] + (ulong)(uVar11 >> 0x16 & 0x3fc));
      uVar13 = saes_table[1][uVar10 >> 8 & 0xff];
      uVar14 = saes_table[0][uVar9 & 0xff];
      uVar15 = saes_table[1][uVar11 >> 8 & 0xff];
      uVar10 = saes_table[0][uVar10 & 0xff];
      uVar11 = *(uint *)((long)saes_table[2] + (ulong)(uVar11 >> 0xe & 0x3fc));
      uVar16 = *(uint *)((long)saes_table[2] + (ulong)(uVar12 >> 0xe & 0x3fc));
      uVar12 = *(uint *)((long)saes_table[3] + (ulong)(uVar12 >> 0x16 & 0xfffffffc));
      uVar9 = *(uint *)((long)saes_table[3] + (ulong)(uVar9 >> 0x16 & 0x3fc));
      lVar40 = *(long *)((long)(puVar32 + (uVar77 ^ 0x30)) + 8);
      lVar41 = *(long *)(puVar32 + (uVar77 ^ 0x10));
      lVar42 = *(long *)((long)(puVar32 + (uVar77 ^ 0x10)) + 8);
      lVar43 = *(long *)(puVar32 + (uVar77 ^ 0x20));
      lVar44 = *(long *)((long)(puVar32 + (uVar77 ^ 0x20)) + 8);
      *(ulong *)(puVar32 + (uVar77 ^ 0x10)) = *(long *)(puVar32 + (uVar77 ^ 0x30)) + local_e8;
      *(ulong *)((long)(puVar32 + (uVar77 ^ 0x10)) + 8) = lVar40 + uStack_e0;
      *(ulong *)(puVar32 + (uVar77 ^ 0x20)) = lVar41 + local_1a8;
      *(ulong *)((long)(puVar32 + (uVar77 ^ 0x20)) + 8) = lVar42 + uStack_1a0;
      *(ulong *)(puVar32 + (uVar77 ^ 0x30)) = lVar43 + uVar82;
      *(ulong *)((long)(puVar32 + (uVar77 ^ 0x30)) + 8) = lVar44 + uVar89;
      uVar99 = CONCAT44(uVar15 ^ uVar10 ^ uVar16 ^ uVar9,uVar13 ^ uVar14 ^ uVar11 ^ uVar12) ^ uVar82
      ;
      uVar102 = CONCAT44(uVar3 ^ uVar4 ^ uVar6 ^ uVar8,uVar69 ^ uVar2 ^ uVar5 ^ uVar7) ^ uVar89;
      *(ulong *)(puVar32 + uVar77) = uVar99 ^ local_1a8;
      *(ulong *)((long)(puVar32 + uVar77) + 8) = uVar102 ^ uStack_1a0;
      uVar68 = auVar103._0_8_;
      uVar73 = uVar68 & 0xffff0;
      uVar71 = local_1d8 << 0x20 ^ uVar116 ^ *(ulong *)(puVar27 + uVar73);
      uVar57 = (ulong)(auVar103._0_4_ + (int)local_1d8 * 2 & 0x7ffffffe) | 0x80000001;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar71;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar68;
      uVar59 = SUB168(auVar105 * auVar36,8);
      uVar55 = SUB168(auVar105 * auVar36,0);
      auVar52._8_8_ = uVar112;
      auVar52._0_8_ = uVar108;
      uVar66 = *(ulong *)(puVar27 + (uVar73 ^ 0x10));
      uVar72 = *(ulong *)((long)(puVar27 + (uVar73 ^ 0x10)) + 8);
      uVar75 = uVar73 ^ 0x20;
      uVar77 = *(ulong *)(puVar27 + uVar75);
      uVar78 = uVar108 & 0xffff0;
      uVar61 = *(ulong *)(puVar27 + uVar75 + 8);
      uVar76 = uVar64 & 0xffff0;
      lVar40 = *(long *)((long)(puVar27 + (uVar73 ^ 0x30)) + 8);
      uVar60 = local_1c8 << 0x20 ^ uVar115 ^ *(ulong *)(puVar28 + uVar78);
      uVar65 = local_1b8 << 0x20 ^ uVar96 ^ *(ulong *)(puVar30 + uVar76);
      uVar58 = uVar99 & 0xffff0;
      uVar70 = lVar63 << 0x20 ^ uVar67 ^ *(ulong *)(puVar32 + uVar58);
      lVar41 = *(long *)(puVar27 + uVar75);
      lVar42 = *(long *)((long)(puVar27 + uVar75) + 8);
      uVar1 = *(undefined8 *)(puVar27 + uVar73 + 8);
      uVar116 = *(ulong *)(puVar28 + uVar78 + 8);
      uVar96 = *(ulong *)(puVar30 + uVar76 + 8);
      uVar74 = *(ulong *)(puVar32 + uVar58 + 8);
      *(ulong *)(puVar27 + (uVar73 ^ 0x10)) = uVar80 + *(long *)(puVar27 + (uVar73 ^ 0x30));
      *(ulong *)((long)(puVar27 + (uVar73 ^ 0x10)) + 8) = uVar81 + lVar40;
      *(ulong *)(puVar27 + uVar75) = (uVar59 ^ uVar66) + uVar107;
      *(ulong *)((long)(puVar27 + uVar75) + 8) = (uVar55 ^ uVar72) + uVar111;
      *(long *)(puVar27 + (uVar73 ^ 0x30)) = lVar41 + lVar94;
      *(long *)((long)(puVar27 + (uVar73 ^ 0x30)) + 8) = lVar42 + lVar95;
      auVar104._0_8_ = (uVar59 ^ uVar77) + lVar94;
      auVar104._8_8_ = (uVar55 ^ uVar61) + lVar95;
      *(undefined1 (*) [16])(puVar27 + uVar73) = auVar104;
      uVar66 = (ulong)((int)uVar108 + (int)local_1c8 * 2 & 0x7ffffffe) | 0x80000001;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar60;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar108;
      uVar61 = SUB168(auVar33 * auVar37,8);
      uVar77 = SUB168(auVar33 * auVar37,0);
      uVar72 = uVar78 ^ 0x20;
      uVar115 = *(ulong *)(puVar28 + uVar72);
      uVar80 = *(ulong *)(puVar28 + (uVar78 ^ 0x10));
      uVar81 = *(ulong *)((long)(puVar28 + (uVar78 ^ 0x10)) + 8);
      uVar67 = *(ulong *)(puVar28 + uVar72 + 8);
      lVar40 = *(long *)((long)(puVar28 + (uVar78 ^ 0x30)) + 8);
      lVar41 = *(long *)(puVar28 + uVar72);
      lVar42 = *(long *)((long)(puVar28 + uVar72) + 8);
      *(ulong *)(puVar28 + (uVar78 ^ 0x10)) = uVar56 + *(long *)(puVar28 + (uVar78 ^ 0x30));
      *(ulong *)((long)(puVar28 + (uVar78 ^ 0x10)) + 8) = uVar62 + lVar40;
      *(ulong *)(puVar28 + uVar72) = (uVar61 ^ uVar80) + uVar97;
      *(ulong *)((long)(puVar28 + uVar72) + 8) = (uVar77 ^ uVar81) + uVar98;
      *(ulong *)(puVar28 + (uVar78 ^ 0x30)) = lVar41 + uVar109;
      *(ulong *)((long)(puVar28 + (uVar78 ^ 0x30)) + 8) = lVar42 + uVar113;
      uVar109 = (uVar61 ^ uVar115) + uVar109;
      uVar113 = (uVar77 ^ uVar67) + uVar113;
      *(ulong *)(puVar28 + uVar78) = uVar109;
      *(ulong *)((long)(puVar28 + uVar78) + 8) = uVar113;
      uVar77 = (ulong)((int)uVar64 + (int)local_1b8 * 2 & 0x7ffffffe) | 0x80000001;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar65;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar64;
      uVar62 = SUB168(auVar34 * auVar38,8);
      uVar56 = SUB168(auVar34 * auVar38,0);
      uVar61 = uVar76 ^ 0x20;
      uVar115 = *(ulong *)(puVar30 + uVar61);
      uVar80 = *(ulong *)(puVar30 + (uVar76 ^ 0x10));
      uVar81 = *(ulong *)((long)(puVar30 + (uVar76 ^ 0x10)) + 8);
      uVar67 = *(ulong *)(puVar30 + uVar61 + 8);
      lVar40 = *(long *)((long)(puVar30 + (uVar76 ^ 0x30)) + 8);
      lVar41 = *(long *)(puVar30 + uVar61);
      lVar42 = *(long *)((long)(puVar30 + uVar61) + 8);
      *(ulong *)(puVar30 + (uVar76 ^ 0x10)) = uVar87 + *(long *)(puVar30 + (uVar76 ^ 0x30));
      *(ulong *)((long)(puVar30 + (uVar76 ^ 0x10)) + 8) = uVar88 + lVar40;
      *(ulong *)(puVar30 + uVar61) = (uVar62 ^ uVar80) + uVar91;
      *(ulong *)((long)(puVar30 + uVar61) + 8) = (uVar56 ^ uVar81) + uVar93;
      *(ulong *)(puVar30 + (uVar76 ^ 0x30)) = lVar41 + uVar79;
      *(ulong *)((long)(puVar30 + (uVar76 ^ 0x30)) + 8) = lVar42 + uVar86;
      auVar83._8_8_ = uVar1;
      auVar83._0_8_ = uVar71;
      auVar83 = auVar83 ^ auVar104;
      uVar109 = uVar60 ^ uVar109;
      uVar113 = uVar116 ^ uVar113;
      uVar79 = (uVar62 ^ uVar115) + uVar79;
      uVar86 = (uVar56 ^ uVar67) + uVar86;
      *(ulong *)(puVar30 + uVar76) = uVar79;
      *(ulong *)((long)(puVar30 + uVar76) + 8) = uVar86;
      uVar67 = (ulong)((int)uVar99 + (int)lVar63 * 2 & 0x7ffffffe) | 0x80000001;
      uVar115 = uVar112 / uVar66 & 0xffffffff | uVar112 % uVar66 << 0x20;
      uVar116 = auVar103._8_8_ / uVar57 & 0xffffffff | auVar103._8_8_ % uVar57 << 0x20;
      uVar79 = uVar65 ^ uVar79;
      uVar86 = uVar96 ^ uVar86;
      uVar67 = uVar102 / uVar67 & 0xffffffff | uVar102 % uVar67 << 0x20;
      uVar96 = uVar106 / uVar77 & 0xffffffff | uVar106 % uVar77 << 0x20;
      auVar100._0_8_ = uVar99 + uVar67;
      auVar100._8_8_ = uVar64 + uVar96;
      auVar84._0_8_ = auVar100._0_8_ >> 0xc;
      auVar84._8_8_ = auVar100._8_8_ >> 0xc;
      auVar105 = sqrtpd(auVar104,auVar84 | _DAT_0018f250);
      uVar80 = auVar105._0_8_ >> 0x14;
      uVar87 = auVar105._8_8_ >> 0x14;
      uVar55 = auVar105._0_8_ >> 0x13;
      uVar72 = auVar105._8_8_ >> 0x13;
      uVar81 = uVar80 - 0x3fe00000000;
      uVar88 = uVar87 - 0x3fe00000000;
      uVar77 = (uVar55 - uVar80) - 0x3fdffffffff;
      uVar57 = (uVar72 - uVar87) - 0x3fdffffffff;
      auVar90._0_8_ = uVar108 + uVar115;
      auVar90._8_8_ = uVar68 + uVar116;
      auVar85._0_8_ = auVar90._0_8_ >> 0xc;
      auVar85._8_8_ = auVar90._8_8_ >> 0xc;
      auVar105 = sqrtpd(auVar52,auVar85 | _DAT_0018f250);
      uVar80 = auVar105._0_8_ >> 0x14;
      uVar56 = auVar105._8_8_ >> 0x14;
      uVar61 = auVar105._0_8_ >> 0x13;
      uVar66 = auVar105._8_8_ >> 0x13;
      uVar87 = uVar80 - 0x3fe00000000;
      uVar62 = uVar56 - 0x3fe00000000;
      uVar80 = (uVar61 - uVar80) - 0x3fdffffffff;
      uVar56 = (uVar66 - uVar56) - 0x3fdffffffff;
      auVar92._0_8_ =
           (uVar80 & 0xffffffff) * (uVar87 & 0xffffffff) +
           ((uVar80 >> 0x20) * (uVar87 & 0xffffffff) + (uVar87 >> 0x20) * (uVar80 & 0xffffffff) <<
           0x20);
      auVar92._8_8_ =
           (uVar56 & 0xffffffff) * (uVar62 & 0xffffffff) +
           ((uVar56 >> 0x20) * (uVar62 & 0xffffffff) + (uVar62 >> 0x20) * (uVar56 & 0xffffffff) <<
           0x20);
      auVar92 = auVar92 ^ _DAT_0018bc00;
      auVar90 = auVar90 ^ _DAT_0018bc00;
      auVar114._0_8_ =
           (uVar77 & 0xffffffff) * (uVar81 & 0xffffffff) +
           ((uVar77 >> 0x20) * (uVar81 & 0xffffffff) + (uVar81 >> 0x20) * (uVar77 & 0xffffffff) <<
           0x20);
      auVar114._8_8_ =
           (uVar57 & 0xffffffff) * (uVar88 & 0xffffffff) +
           ((uVar57 >> 0x20) * (uVar88 & 0xffffffff) + (uVar88 >> 0x20) * (uVar57 & 0xffffffff) <<
           0x20);
      auVar114 = auVar114 ^ _DAT_0018bc00;
      auVar100 = auVar100 ^ _DAT_0018bc00;
      auVar101._0_4_ = -(uint)(auVar100._4_4_ == auVar114._4_4_ && auVar114._0_4_ < auVar100._0_4_);
      auVar101._4_4_ =
           -(uint)(auVar100._12_4_ == auVar114._12_4_ && auVar114._8_4_ < auVar100._8_4_);
      auVar101._8_4_ = -(uint)(auVar90._4_4_ == auVar92._4_4_ && auVar92._0_4_ < auVar90._0_4_);
      auVar101._12_4_ = -(uint)(auVar90._12_4_ == auVar92._12_4_ && auVar92._8_4_ < auVar90._8_4_);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar70;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar99;
      uVar62 = SUB168(auVar35 * auVar39,8);
      uVar56 = SUB168(auVar35 * auVar39,0);
      auVar110._4_4_ = -(uint)(auVar114._12_4_ < auVar100._12_4_);
      auVar110._0_4_ = -(uint)(auVar114._4_4_ < auVar100._4_4_);
      auVar110._8_4_ = -(uint)(auVar92._4_4_ < auVar90._4_4_);
      auVar110._12_4_ = -(uint)(auVar92._12_4_ < auVar90._12_4_);
      uVar77 = uVar58 ^ 0x20;
      uVar80 = *(ulong *)(puVar32 + uVar77);
      uVar81 = *(ulong *)(puVar32 + uVar77 + 8);
      lVar63 = *(long *)((long)(puVar32 + (uVar58 ^ 0x30)) + 8);
      uVar87 = *(ulong *)(puVar32 + (uVar58 ^ 0x10));
      uVar88 = *(ulong *)((long)(puVar32 + (uVar58 ^ 0x10)) + 8);
      lVar40 = *(long *)(puVar32 + uVar77);
      lVar41 = *(long *)((long)(puVar32 + uVar77) + 8);
      *(ulong *)(puVar32 + (uVar58 ^ 0x10)) = local_e8 + *(long *)(puVar32 + (uVar58 ^ 0x30));
      *(ulong *)((long)(puVar32 + (uVar58 ^ 0x10)) + 8) = uStack_e0 + lVar63;
      uVar69 = movmskps((int)uVar99,auVar110 | auVar101);
      local_e8 = local_1a8;
      uStack_e0 = uStack_1a0;
      *(ulong *)(puVar32 + uVar77) = (uVar62 ^ uVar87) + local_1a8;
      *(ulong *)((long)(puVar32 + uVar77) + 8) = (uVar56 ^ uVar88) + uStack_1a0;
      *(ulong *)(puVar32 + (uVar58 ^ 0x30)) = lVar40 + uVar82;
      *(ulong *)((long)(puVar32 + (uVar58 ^ 0x30)) + 8) = lVar41 + uVar89;
      bVar53 = (byte)uVar69;
      local_1d8 = (uVar66 & 0xffffffff) + (ulong)(bVar53 >> 3);
      local_1c8 = uVar61 + ((bVar53 & 4) >> 2);
      local_1b8 = (uVar72 & 0xffffffff) + (ulong)((bVar53 & 2) >> 1);
      uVar72 = auVar83._0_8_;
      uVar82 = (uVar62 ^ uVar80) + uVar82;
      uVar89 = (uVar56 ^ uVar81) + uVar89;
      *(ulong *)(puVar32 + uVar58) = uVar82;
      *(ulong *)((long)(puVar32 + uVar58) + 8) = uVar89;
      uVar82 = uVar70 ^ uVar82;
      uVar89 = uVar74 ^ uVar89;
      lVar63 = uVar55 + (uVar69 & 1);
      uVar54 = uVar54 - 1;
      auVar105 = auVar103;
      uVar80 = uVar107;
      uVar81 = uVar111;
      uVar87 = uVar91;
      uVar88 = uVar93;
      uVar56 = uVar97;
      uVar62 = uVar98;
      local_1a8 = uVar99;
      uStack_1a0 = uVar102;
    } while (uVar54 != 0);
  }
  lVar63 = 0;
  do {
    pcVar25 = ctx[lVar63];
    cn_implode_scratchpad<true>((__m128i *)pcVar25->memory,(__m128i *)pcVar25);
    keccakf((uint64_t *)pcVar25,0x18);
    (*(code *)(&extra_hashes)[(byte)*(longlong *)pcVar25->state & 3])(pcVar25,200,output);
    lVar63 = lVar63 + 1;
    output = output + 0x20;
  } while (lVar63 != 4);
  return;
}

Assistant:

inline void cryptonight_quad_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    for (size_t i = 0; i < 4; i++) {
        keccak(input + size * i, size, ctx[i]->state);
        cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->state), reinterpret_cast<__m128i*>(ctx[i]->memory));
    }

    uint8_t* l0  = ctx[0]->memory;
    uint8_t* l1  = ctx[1]->memory;
    uint8_t* l2  = ctx[2]->memory;
    uint8_t* l3  = ctx[3]->memory;
    uint64_t* h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint64_t* h1 = reinterpret_cast<uint64_t*>(ctx[1]->state);
    uint64_t* h2 = reinterpret_cast<uint64_t*>(ctx[2]->state);
    uint64_t* h3 = reinterpret_cast<uint64_t*>(ctx[3]->state);

    CONST_INIT(ctx[0], 0);
    CONST_INIT(ctx[1], 1);
    CONST_INIT(ctx[2], 2);
    CONST_INIT(ctx[3], 3);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t idx0, idx1, idx2, idx3;
    idx0 = _mm_cvtsi128_si64(ax0);
    idx1 = _mm_cvtsi128_si64(ax1);
    idx2 = _mm_cvtsi128_si64(ax2);
    idx3 = _mm_cvtsi128_si64(ax3);

    for (size_t i = 0; i < iters; i++) {
        uint64_t hi, lo;
        __m128i *ptr0, *ptr1, *ptr2, *ptr3;

        CN_STEP1(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP1(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP1(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP1(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP2(ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP2(ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP2(ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP2(ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP3(0, ax0, bx00, bx01, cx0, l0, ptr0, idx0);
        CN_STEP3(1, ax1, bx10, bx11, cx1, l1, ptr1, idx1);
        CN_STEP3(2, ax2, bx20, bx21, cx2, l2, ptr2, idx2);
        CN_STEP3(3, ax3, bx30, bx31, cx3, l3, ptr3, idx3);

        CN_STEP4(0, ax0, bx00, bx01, cx0, l0, mc0, ptr0, idx0);
        CN_STEP4(1, ax1, bx10, bx11, cx1, l1, mc1, ptr1, idx1);
        CN_STEP4(2, ax2, bx20, bx21, cx2, l2, mc2, ptr2, idx2);
        CN_STEP4(3, ax3, bx30, bx31, cx3, l3, mc3, ptr3, idx3);
    }

    for (size_t i = 0; i < 4; i++) {
        cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i*>(ctx[i]->memory), reinterpret_cast<__m128i*>(ctx[i]->state));
        keccakf(reinterpret_cast<uint64_t*>(ctx[i]->state), 24);
        extra_hashes[ctx[i]->state[0] & 3](ctx[i]->state, 200, output + 32 * i);
    }
}